

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

char * GPU_GetErrorString(GPU_ErrorEnum error)

{
  char *pcStack_10;
  GPU_ErrorEnum error_local;
  
  switch(error) {
  case GPU_ERROR_NONE:
    pcStack_10 = "NO ERROR";
    break;
  case GPU_ERROR_BACKEND_ERROR:
    pcStack_10 = "BACKEND ERROR";
    break;
  case GPU_ERROR_DATA_ERROR:
    pcStack_10 = "DATA ERROR";
    break;
  case GPU_ERROR_USER_ERROR:
    pcStack_10 = "USER ERROR";
    break;
  case GPU_ERROR_UNSUPPORTED_FUNCTION:
    pcStack_10 = "UNSUPPORTED FUNCTION";
    break;
  case GPU_ERROR_NULL_ARGUMENT:
    pcStack_10 = "NULL ARGUMENT";
    break;
  case GPU_ERROR_FILE_NOT_FOUND:
    pcStack_10 = "FILE NOT FOUND";
    break;
  default:
    pcStack_10 = "UNKNOWN ERROR";
  }
  return pcStack_10;
}

Assistant:

const char* GPU_GetErrorString(GPU_ErrorEnum error)
{
    switch(error)
    {
    case GPU_ERROR_NONE:
        return "NO ERROR";
    case GPU_ERROR_BACKEND_ERROR:
        return "BACKEND ERROR";
    case GPU_ERROR_DATA_ERROR:
        return "DATA ERROR";
    case GPU_ERROR_USER_ERROR:
        return "USER ERROR";
    case GPU_ERROR_UNSUPPORTED_FUNCTION:
        return "UNSUPPORTED FUNCTION";
    case GPU_ERROR_NULL_ARGUMENT:
        return "NULL ARGUMENT";
    case GPU_ERROR_FILE_NOT_FOUND:
        return "FILE NOT FOUND";
    }
    return "UNKNOWN ERROR";
}